

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFusion::CheckCondition(LoopFusion *this)

{
  Loop *pLVar1;
  bool bVar2;
  Op OVar3;
  Op OVar4;
  uint32_t uVar5;
  Instruction *this_00;
  Instruction *this_01;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Instruction *arg_1;
  Instruction *arg_0;
  uint32_t i;
  Instruction *condition_1;
  Instruction *condition_0;
  LoopFusion *this_local;
  
  this_00 = Loop::GetConditionInst(this->loop_0_);
  this_01 = Loop::GetConditionInst(this->loop_1_);
  pLVar1 = this->loop_0_;
  OVar3 = opt::Instruction::opcode(this_00);
  bVar2 = Loop::IsSupportedCondition(pLVar1,OVar3);
  if (bVar2) {
    pLVar1 = this->loop_1_;
    OVar3 = opt::Instruction::opcode(this_01);
    bVar2 = Loop::IsSupportedCondition(pLVar1,OVar3);
    if (bVar2) {
      OVar3 = opt::Instruction::opcode(this_00);
      OVar4 = opt::Instruction::opcode(this_01);
      if (OVar3 != OVar4) {
        return false;
      }
      arg_0._4_4_ = 0;
      do {
        uVar5 = opt::Instruction::NumInOperandWords(this_00);
        if (uVar5 <= arg_0._4_4_) {
          return true;
        }
        pDVar6 = IRContext::get_def_use_mgr(this->context_);
        uVar5 = opt::Instruction::GetSingleWordInOperand(this_00,arg_0._4_4_);
        pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar5);
        pDVar6 = IRContext::get_def_use_mgr(this->context_);
        uVar5 = opt::Instruction::GetSingleWordInOperand(this_01,arg_0._4_4_);
        pIVar8 = analysis::DefUseManager::GetDef(pDVar6,uVar5);
        if ((pIVar7 != this->induction_0_) || (pIVar8 != this->induction_1_)) {
          if ((pIVar7 == this->induction_0_) && (pIVar8 != this->induction_1_)) {
            return false;
          }
          if ((pIVar8 == this->induction_1_) && (pIVar7 != this->induction_0_)) {
            return false;
          }
          if (pIVar7 != pIVar8) {
            return false;
          }
        }
        arg_0._4_4_ = arg_0._4_4_ + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool LoopFusion::CheckCondition() {
  auto condition_0 = loop_0_->GetConditionInst();
  auto condition_1 = loop_1_->GetConditionInst();

  if (!loop_0_->IsSupportedCondition(condition_0->opcode()) ||
      !loop_1_->IsSupportedCondition(condition_1->opcode())) {
    return false;
  }

  if (condition_0->opcode() != condition_1->opcode()) {
    return false;
  }

  for (uint32_t i = 0; i < condition_0->NumInOperandWords(); ++i) {
    auto arg_0 = context_->get_def_use_mgr()->GetDef(
        condition_0->GetSingleWordInOperand(i));
    auto arg_1 = context_->get_def_use_mgr()->GetDef(
        condition_1->GetSingleWordInOperand(i));

    if (arg_0 == induction_0_ && arg_1 == induction_1_) {
      continue;
    }

    if (arg_0 == induction_0_ && arg_1 != induction_1_) {
      return false;
    }

    if (arg_1 == induction_1_ && arg_0 != induction_0_) {
      return false;
    }

    if (arg_0 != arg_1) {
      return false;
    }
  }

  return true;
}